

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.h
# Opt level: O1

void __thiscall gui::MultilineTextBox::~MultilineTextBox(MultilineTextBox *this)

{
  pointer puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)&PTR__MultilineTextBox_0027d968
  ;
  std::vector<sf::RectangleShape,_std::allocator<sf::RectangleShape>_>::~vector
            (&this->selectionLines_);
  puVar1 = (this->visibleString_).m_string._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)puVar1 != &(this->visibleString_).m_string.field_2) {
    operator_delete(puVar1);
  }
  std::vector<sf::String,_std::allocator<sf::String>_>::~vector(&this->defaultStrings_);
  std::vector<sf::String,_std::allocator<sf::String>_>::~vector(&this->boxStrings_);
  puVar1 = (this->regexPattern_).m_string._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)puVar1 != &(this->regexPattern_).m_string.field_2) {
    operator_delete(puVar1);
  }
  this_00 = (this->style_).
            super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_unsigned_long>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_unsigned_long>_>_>_>
  ::~_Rb_tree(&(this->onTextChange).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onClick).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onMouseRelease).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onMousePress).callbacks_._M_t);
  Widget::~Widget(&this->super_Widget);
  return;
}

Assistant:

virtual ~MultilineTextBox() = default;